

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O2

CMCondition CMCondition_find(CMControlList cl,int condition)

{
  CMCondition p_Var1;
  
  p_Var1 = (CMCondition)&cl->condition_list;
  do {
    p_Var1 = p_Var1->next;
    if (p_Var1 == (CMCondition)0x0) {
      fprintf(_stderr,"Serious internal error.  Use of condition %d, no longer in control list\n");
      return (CMCondition)0x0;
    }
  } while (p_Var1->condition_num != condition);
  return p_Var1;
}

Assistant:

static CMCondition
CMCondition_find(CMControlList cl, int condition)
{
    CMCondition next = cl->condition_list;
    while (next != NULL) {
	if (next->condition_num == condition) {
	    return next;
	}
	next = next->next;
    }
    fprintf(stderr, "Serious internal error.  Use of condition %d, no longer in control list\n", condition);
    return NULL;
}